

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

result __thiscall
dtc::anon_unknown_1::binary_operator<13,_std::logical_and<unsigned_long_long>_>::operator()
          (binary_operator<13,_std::logical_and<unsigned_long_long>_> *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  uint extraout_EDX;
  ulong extraout_RDX;
  undefined8 uVar4;
  result rVar5;
  
  iVar1 = (**((this->super_binary_operator_base).lhs._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  iVar2 = (**((this->super_binary_operator_base).rhs._M_t.
              super___uniq_ptr_impl<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              ._M_t.
              super__Tuple_impl<0UL,_dtc::(anonymous_namespace)::expression_*,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
              .super__Head_base<0UL,_dtc::(anonymous_namespace)::expression_*,_false>._M_head_impl)
             ->_vptr_expression)();
  if (((extraout_EDX & 1) == 0) || ((extraout_RDX & 1) == 0)) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar3 = (ulong)(CONCAT44(extraout_var_00,iVar2) != 0 && CONCAT44(extraout_var,iVar1) != 0);
    uVar4 = CONCAT71((int7)(extraout_RDX >> 8),1);
  }
  rVar5._8_8_ = uVar4;
  rVar5.first = uVar3;
  return rVar5;
}

Assistant:

result operator()() override
	{
		Op op;
		result l = (*lhs)();
		result r = (*rhs)();
		if (!(l.second && r.second))
		{
			return {0, false};
		}
		return {op(l.first, r.first), true};
	}